

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLOutput.cpp
# Opt level: O0

void __thiscall Test::XMLOutput::XMLOutput(XMLOutput *this,string *outputFile)

{
  pointer __p;
  type pbVar1;
  string *outputFile_local;
  XMLOutput *this_local;
  
  CollectorOutput::CollectorOutput(&this->super_CollectorOutput);
  (this->super_CollectorOutput).super_Output._vptr_Output = (_func_int **)&PTR__XMLOutput_001a1b48;
  __p = (pointer)operator_new(0x200);
  std::ofstream::ofstream(__p,(string *)outputFile,_S_out);
  std::unique_ptr<std::ostream,std::default_delete<std::ostream>>::
  unique_ptr<std::default_delete<std::ostream>,void>
            ((unique_ptr<std::ostream,std::default_delete<std::ostream>> *)&this->fileStream,__p);
  pbVar1 = std::
           unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
           ::operator*(&this->fileStream);
  this->output = pbVar1;
  std::operator<<(this->output,"<?xml version=\"1.0\" ?>\n<testsuites>\n");
  return;
}

Assistant:

XMLOutput::XMLOutput(const std::string &outputFile) : fileStream(new std::ofstream(outputFile)), output(*fileStream) {
  output << "<?xml version=\"1.0\" ?>\n<testsuites>\n";
}